

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O3

void uss_rename(SftpServer *srv,SftpReplyBuilder *reply,ptrlen srcpath,ptrlen dstpath)

{
  int iVar1;
  char *__old;
  SftpReplyBuilder *__new;
  SftpReplyBuilder *reply_00;
  
  __old = mkstr(srcpath);
  __new = (SftpReplyBuilder *)mkstr(dstpath);
  reply_00 = __new;
  iVar1 = rename(__old,(char *)__new);
  free(__old);
  free(__new);
  if (-1 < iVar1) {
    (*reply->vt->reply_ok)(reply);
    return;
  }
  uss_error((UnixSftpServer *)reply,reply_00);
  return;
}

Assistant:

static void uss_rename(SftpServer *srv, SftpReplyBuilder *reply,
                       ptrlen srcpath, ptrlen dstpath)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *srcstr = mkstr(srcpath), *dststr = mkstr(dstpath);
    int status = rename(srcstr, dststr);
    free(srcstr);
    free(dststr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        fxp_reply_ok(reply);
    }
}